

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

value * __thiscall
mjs::string_object::get(value *__return_storage_ptr__,string_object *this,wstring_view *name)

{
  bool bVar1;
  gc_heap *h;
  string local_50;
  size_t local_40;
  wchar_t *local_38;
  undefined1 local_30 [8];
  wstring_view s;
  wstring_view *name_local;
  string_object *this_local;
  
  local_40 = name->_M_len;
  local_38 = name->_M_str;
  s._M_str = (wchar_t *)name;
  _local_30 = handle_array_like_access(this,*name);
  bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_30);
  if (bVar1) {
    native_object::get(__return_storage_ptr__,&this->super_native_object,(wstring_view *)s._M_str);
  }
  else {
    h = object::heap((object *)this);
    string::string(&local_50,h,(wstring_view *)local_30);
    value::value(__return_storage_ptr__,&local_50);
    string::~string(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

value get(const std::wstring_view& name) const override {
        if (const auto s = handle_array_like_access(name); !s.empty()) {
            return value{string{heap(), s}};
        }
        return native_object::get(name);
    }